

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddConfigVariableFlags
          (cmLocalGenerator *this,string *flags,string *var,string *config)

{
  string *psVar1;
  ulong uVar2;
  string local_70;
  char local_49;
  undefined1 local_48 [8];
  string flagsVar;
  string *config_local;
  string *var_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  flagsVar.field_2._8_8_ = config;
  psVar1 = cmMakefile::GetSafeDefinition(this->Makefile,var);
  (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,flags,psVar1);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_49 = '_';
    cmsys::SystemTools::UpperCase(&local_70,(string *)flagsVar.field_2._8_8_);
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string>
              ((string *)local_48,var,&local_49,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    psVar1 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_48);
    (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,flags,psVar1);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddConfigVariableFlags(std::string& flags,
                                              const std::string& var,
                                              const std::string& config)
{
  // Add the flags from the variable itself.
  this->AppendFlags(flags, this->Makefile->GetSafeDefinition(var));
  // Add the flags from the build-type specific variable.
  if (!config.empty()) {
    const std::string flagsVar =
      cmStrCat(var, '_', cmSystemTools::UpperCase(config));
    this->AppendFlags(flags, this->Makefile->GetSafeDefinition(flagsVar));
  }
}